

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::TokenManager::GetPublicKeyInToken
          (Error *__return_storage_ptr__,TokenManager *this,ByteArray *aPublicKey)

{
  ErrorCode EVar1;
  uint8_t *aBuf;
  Error *pEVar2;
  undefined1 local_98 [40];
  size_t publicKeyLength;
  CborMap token;
  CborMap publicKey;
  CborMap cnf;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  CborMap::CborMap(&token);
  CborMap::CborMap(&cnf);
  CborMap::CborMap(&publicKey);
  ValidateToken((Error *)local_98,this,&token,&this->mSignedToken,&this->mDomainCAPublicKey);
  pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)local_98);
  EVar1 = pEVar2->mCode;
  std::__cxx11::string::~string((string *)(local_98 + 8));
  if (EVar1 == kNone) {
    CborMap::Get((Error *)local_98,&token,8,&cnf);
    pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)local_98);
    EVar1 = pEVar2->mCode;
    std::__cxx11::string::~string((string *)(local_98 + 8));
    if (EVar1 == kNone) {
      CborMap::Get((Error *)local_98,&cnf,1,&publicKey);
      pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)local_98);
      EVar1 = pEVar2->mCode;
      std::__cxx11::string::~string((string *)(local_98 + 8));
      if (EVar1 == kNone) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(aPublicKey,0x400);
        aBuf = (aPublicKey->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
               _M_impl.super__Vector_impl_data._M_start;
        CborValue::Serialize
                  ((Error *)local_98,&publicKey.super_CborValue,aBuf,&publicKeyLength,
                   (long)(aPublicKey->
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                         super__Vector_impl_data._M_finish - (long)aBuf);
        std::__cxx11::string::~string((string *)(local_98 + 8));
        if (local_98._0_4_ != kNone) {
          abort();
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (aPublicKey,publicKeyLength);
      }
    }
  }
  CborValue::Free(&token.super_CborValue);
  return __return_storage_ptr__;
}

Assistant:

Error TokenManager::GetPublicKeyInToken(ByteArray &aPublicKey) const
{
    static constexpr size_t kMaxSignedTokenLength = 1024;

    Error   error;
    CborMap token;
    CborMap cnf;
    CborMap publicKey;
    size_t  publicKeyLength;

    SuccessOrExit(error = ValidateToken(token, mSignedToken, mDomainCAPublicKey));
    SuccessOrExit(error = token.Get(cwt::kCnf, cnf));
    SuccessOrExit(error = cnf.Get(cwt::kCoseKey, publicKey));

    aPublicKey.resize(kMaxSignedTokenLength);
    SuccessOrDie(publicKey.Serialize(aPublicKey.data(), publicKeyLength, aPublicKey.size()));
    aPublicKey.resize(publicKeyLength);

exit:
    token.Free();
    return error;
}